

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::dx
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI,
                     in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::val
                    ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                     0x1efc9c7);
  vVar3 = FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::dx
                    (in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x1efc9f2);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}